

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ctl.c
# Opt level: O2

_Bool ctl_arenas_i_verify(size_t i)

{
  byte bVar1;
  uint uVar2;
  
  uVar2 = arenas_i2a_impl(i,true,true);
  if (uVar2 == 0xffffffff) {
    bVar1 = 1;
  }
  else {
    bVar1 = ctl_arenas->duckdb_je_arenas[uVar2]->initialized ^ 1;
  }
  return (_Bool)bVar1;
}

Assistant:

static bool
ctl_arenas_i_verify(size_t i) {
	size_t a = arenas_i2a_impl(i, true, true);
	if (a == UINT_MAX || !ctl_arenas->arenas[a]->initialized) {
		return true;
	}

	return false;
}